

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Bound_Function::build_param_list
          (Bound_Function *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params)

{
  bool bVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RDI;
  const_iterator barg;
  const_iterator parg;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *args;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_ffffffffffffff28;
  Type_Info *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Type_Info *in_stack_ffffffffffffff40;
  byte local_b2;
  bool local_b1;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_28;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (Boxed_Value *)
       std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                 (in_stack_ffffffffffffff28);
  local_28._M_current =
       (Boxed_Value *)
       std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                 (in_stack_ffffffffffffff28);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x3b4c96);
  while( true ) {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
              (in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff28);
    local_b1 = false;
    if (bVar1) {
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                (in_stack_ffffffffffffff28);
      local_b1 = __gnu_cxx::operator==
                           ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                             *)in_stack_ffffffffffffff28);
    }
    if (((local_b1 ^ 0xffU) & 1) == 0) break;
    while( true ) {
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                (in_stack_ffffffffffffff28);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                          *)in_stack_ffffffffffffff28);
      local_b2 = 0;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
        ::operator->(&local_28);
        in_stack_ffffffffffffff40 = Boxed_Value::get_type_info((Boxed_Value *)0x3b4d5e);
        chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Placeholder_Object>::get();
        bVar1 = Type_Info::operator==
                          (in_stack_ffffffffffffff40,
                           (Type_Info *)
                           CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        local_b2 = bVar1 ^ 0xff;
      }
      if ((local_b2 & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator*(&local_28);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 in_stack_ffffffffffffff40,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_28);
    }
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
              (in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff28);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator*(local_20);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 in_stack_ffffffffffffff40,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(local_20);
    }
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
              (in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        *)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff3f = false;
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator->(&local_28);
      in_stack_ffffffffffffff30 = Boxed_Value::get_type_info((Boxed_Value *)0x3b4e75);
      chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Placeholder_Object>::get();
      in_stack_ffffffffffffff3f =
           Type_Info::operator==
                     (in_stack_ffffffffffffff40,
                      (Type_Info *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    }
    if ((bool)in_stack_ffffffffffffff3f != false) {
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_28);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Boxed_Value> build_param_list(const std::vector<Boxed_Value> &params) const
        {
          auto parg = params.begin();
          auto barg = m_args.begin();

          std::vector<Boxed_Value> args;

          while (!(parg == params.end() && barg == m_args.end()))
          {
            while (barg != m_args.end() 
                && !(barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()))
            {
              args.push_back(*barg);
              ++barg;
            }

            if (parg != params.end())
            {
              args.push_back(*parg);
              ++parg;
            }

            if (barg != m_args.end() 
                && barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get())
            {
              ++barg;
            } 
          }
          return args;
        }